

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_26::IsBitFlagsEnum(EnumDef *enum_def)

{
  Value *pVVar1;
  allocator<char> local_31;
  string local_30;
  EnumDef *local_10;
  EnumDef *enum_def_local;
  
  local_10 = enum_def;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"bit_flags",&local_31);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup
                     (&(enum_def->super_Definition).attributes,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return pVVar1 != (Value *)0x0;
}

Assistant:

static bool IsBitFlagsEnum(const EnumDef &enum_def) {
  return enum_def.attributes.Lookup("bit_flags") != nullptr;
}